

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O3

Var Js::JavascriptMath::Increment_Numeric(Var aRight,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  Var pvVar3;
  undefined4 *puVar4;
  
  bVar2 = VarIs<Js::JavascriptBigInt>(aRight);
  if (bVar2) {
    pvVar3 = JavascriptBigInt::Increment(aRight);
    return pvVar3;
  }
  if (((ulong)aRight & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)aRight & 0xffff000000000000) != 0x1000000000000) {
    bVar2 = false;
    if (((ulong)aRight & 0xffff000000000000) == 0x1000000000000) goto LAB_00a9ada5;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00a9ae4c;
    *puVar4 = 0;
LAB_00a9ada5:
    bVar2 = true;
  }
  if (bVar2 != (((ulong)aRight & 0xfffffffe00000000) == 0x1000000000000)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x3d,"(result == (TaggedInt::Is(aLeft) && TaggedInt::Is(aRight)))",
                                "TaggedInt::IsPair() logic is incorrect");
    if (!bVar2) {
LAB_00a9ae4c:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (((ulong)aRight & 0xfffffffe00000000) == 0x1000000000000) {
    pvVar3 = TaggedInt::Add(aRight,&DAT_1000000000001,scriptContext);
    return pvVar3;
  }
  pvVar3 = Add_Full(aRight,&DAT_1000000000001,scriptContext);
  return pvVar3;
}

Assistant:

Var JavascriptMath::Increment_Numeric(Var aRight, ScriptContext* scriptContext)
        {
            if (VarIs<JavascriptBigInt>(aRight))
            {
                return JavascriptBigInt::Increment(aRight);
            }
            return JavascriptMath::Add(aRight, TaggedInt::ToVarUnchecked(1), scriptContext);
        }